

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderOutput.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderOutputRenderingBase::initTest(GeometryShaderOutputRenderingBase *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar7;
  long lVar6;
  
  if ((this->super_GeometryShaderOutput).super_TestCaseBase.m_is_geometry_shader_extension_supported
      == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
               ,0x147);
    ppuVar7 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar2 = (*((this->super_GeometryShaderOutput).super_TestCaseBase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar2);
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar3;
    GVar3 = (**(code **)(lVar6 + 0x3f0))
                      ((this->super_GeometryShaderOutput).super_TestCaseBase.m_glExtTokens.
                       GEOMETRY_SHADER);
    this->m_geometry_shader_id = GVar3;
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar3;
    GVar3 = (**(code **)(lVar6 + 0x3c8))();
    this->m_program_object_id = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"Could not create program object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                    ,0x155);
    bVar1 = TestCaseBase::buildProgram
                      ((TestCaseBase *)this,this->m_program_object_id,this->m_fragment_shader_id,1,
                       &GeometryShaderOutput::m_fragment_shader_code_white_color,
                       this->m_geometry_shader_id,1,&this->m_geometry_shader_code,
                       this->m_vertex_shader_id,1,
                       &GeometryShaderOutput::m_vertex_shader_code_vec4_0_0_0_1,(bool *)0x0);
    if (bVar1) {
      (**(code **)(lVar6 + 0x6f8))(1,&this->m_color_tex_id);
      (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo_id);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not create framebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                      ,0x163);
      bVar1 = TestCaseBase::setupFramebufferWithTextureAsAttachment
                        ((TestCaseBase *)this,this->m_fbo_id,this->m_color_tex_id,0x8058,0x10,0x10);
      if (bVar1) {
        (**(code **)(lVar6 + 0x708))(1,&this->m_vao_id);
        (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
        uVar5 = (*((this->super_GeometryShaderOutput).super_TestCaseBase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
        if ((uVar5 & 0x300) != 0) {
          (**(code **)(lVar6 + 0x5e0))(0x8642);
        }
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"Could not create vertex array object",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                        ,0x174);
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to setup framebuffer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                 ,0x168);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Could not create program from valid vertex/geometry/fragment shader",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderOutput.cpp"
                 ,0x15c);
    }
    ppuVar7 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderOutputRenderingBase::initTest()
{
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create shader objects */
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	/* Create program object */
	m_program_object_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create program object");

	/* Build the program object */
	if (false == buildProgram(m_program_object_id, m_fragment_shader_id, 1, &m_fragment_shader_code_white_color,
							  m_geometry_shader_id, 1, &m_geometry_shader_code, m_vertex_shader_id, 1,
							  &m_vertex_shader_code_vec4_0_0_0_1))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Set up texture object and a FBO */
	gl.genTextures(1, &m_color_tex_id);
	gl.genFramebuffers(1, &m_fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer");

	if (false ==
		setupFramebufferWithTextureAsAttachment(m_fbo_id, m_color_tex_id, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT))
	{
		TCU_FAIL("Failed to setup framebuffer");
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.enable(GL_PROGRAM_POINT_SIZE);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");
}